

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Vga_ManStop(Vta_Man_t *p)

{
  sat_solver2 *psVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int *piVar4;
  long lVar5;
  
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    Abc_Print(psVar1->nDBreduces,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n"
              ,(ulong)(uint)psVar1->size,(ulong)(psVar1->stats).clauses,
              (ulong)(uint)(psVar1->stats).conflicts,(ulong)(psVar1->stats).learnts,
              (ulong)(uint)psVar1->nDBreduces,(ulong)(uint)p->nCexes,(ulong)(uint)p->nObjAdded);
  }
  pVVar2 = p->vCores;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar2->nSize) {
      lVar5 = 0;
      do {
        pvVar3 = pVVar2->pArray[lVar5];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
            *(undefined8 *)((long)pvVar3 + 8) = 0;
          }
          free(pvVar3);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar2->nSize);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    free(pVVar2);
    p->vCores = (Vec_Ptr_t *)0x0;
  }
  pVVar2 = p->vFrames;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar2->nSize) {
      lVar5 = 0;
      do {
        pvVar3 = pVVar2->pArray[lVar5];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
            *(undefined8 *)((long)pvVar3 + 8) = 0;
          }
          free(pvVar3);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar2->nSize);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    free(pVVar2);
    p->vFrames = (Vec_Ptr_t *)0x0;
  }
  if (p->vSeenGla != (Vec_Bit_t *)0x0) {
    piVar4 = p->vSeenGla->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vSeenGla->pArray = (int *)0x0;
    }
    if (p->vSeenGla != (Vec_Bit_t *)0x0) {
      free(p->vSeenGla);
      p->vSeenGla = (Vec_Bit_t *)0x0;
    }
  }
  if (p->vSeens != (Vec_Int_t *)0x0) {
    piVar4 = p->vSeens->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vSeens->pArray = (int *)0x0;
    }
    if (p->vSeens != (Vec_Int_t *)0x0) {
      free(p->vSeens);
      p->vSeens = (Vec_Int_t *)0x0;
    }
  }
  if (p->vOrder != (Vec_Int_t *)0x0) {
    piVar4 = p->vOrder->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vOrder->pArray = (int *)0x0;
    }
    if (p->vOrder != (Vec_Int_t *)0x0) {
      free(p->vOrder);
      p->vOrder = (Vec_Int_t *)0x0;
    }
  }
  if (p->vAddedNew != (Vec_Int_t *)0x0) {
    piVar4 = p->vAddedNew->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vAddedNew->pArray = (int *)0x0;
    }
    if (p->vAddedNew != (Vec_Int_t *)0x0) {
      free(p->vAddedNew);
      p->vAddedNew = (Vec_Int_t *)0x0;
    }
  }
  sat_solver2_delete(p->pSat);
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  if (p->pObjs != (Vta_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Vta_Obj_t *)0x0;
  }
  if (p != (Vta_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Vga_ManStop( Vta_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), sat_solver2_nconflicts(p->pSat), 
            sat_solver2_nlearnts(p->pSat), p->pSat->nDBreduces, p->nCexes, p->nObjAdded );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vCores );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vFrames );
    Vec_BitFreeP( &p->vSeenGla );
    Vec_IntFreeP( &p->vSeens );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vAddedNew );
    sat_solver2_delete( p->pSat );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}